

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool MTCB(void *a_context,ON__INT_PTR a_id)

{
  double dVar1;
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  bool bVar2;
  int i;
  int iVar3;
  ON_MeshFace *this;
  double distF;
  ON_3dVector local_240;
  ON_3dVector local_228;
  ON_3dVector local_210;
  ON_3dPoint local_1f8;
  undefined1 local_1e0 [8];
  ON_3dPoint ptF;
  double t1;
  double t0;
  ON_3dPoint pts [3];
  int vis [3];
  int ti;
  int local_14c;
  undefined1 local_148 [8];
  ON_3dex fcis [2];
  int local_124;
  int tris;
  double distE;
  ON_3dPoint ptE;
  double local_f0;
  double t;
  double dStack_e0;
  double local_d8;
  double local_c8;
  undefined1 local_b0 [8];
  ON_Line edge;
  ON_3dPoint ptPV;
  int fcip;
  double distV;
  ON_3dPoint ptV;
  int fci;
  int fcc;
  ON_MeshFace *face;
  int fi;
  ON__MTCBDATA *pData;
  ON__INT_PTR a_id_local;
  void *a_context_local;
  
  if (a_context == (void *)0x0) {
    a_context_local._7_1_ = true;
  }
  else {
    *(undefined1 *)((long)a_context + 0x70) = 0;
    i = (int)a_id;
    if ((i < 0) ||
       (iVar3 = ON_SimpleArray<ON_MeshFace>::Count
                          ((ON_SimpleArray<ON_MeshFace> *)(*a_context + 0x40)), iVar3 <= i)) {
      a_context_local._7_1_ = true;
    }
    else {
      this = ON_SimpleArray<ON_MeshFace>::operator[]
                       ((ON_SimpleArray<ON_MeshFace> *)(*a_context + 0x40),i);
      bVar2 = ON_MeshFace::IsTriangle(this);
      ptV.z._4_4_ = 4;
      if (bVar2) {
        ptV.z._4_4_ = 3;
      }
      for (ptV.z._0_4_ = 0; ptV.z._0_4_ < ptV.z._4_4_; ptV.z._0_4_ = ptV.z._0_4_ + 1) {
        ON_Mesh::Vertex((ON_3dPoint *)&distV,*a_context,this->vi[ptV.z._0_4_]);
        dVar1 = ON_3dPoint::DistanceTo((ON_3dPoint *)&distV,(ON_3dPoint *)((long)a_context + 8));
        if (dVar1 < *(double *)((long)a_context + 0x68)) {
          *(double *)((long)a_context + 0x68) = dVar1;
          *(int *)((long)a_context + 0x40) = i;
          *(undefined8 *)((long)a_context + 0x60) = 0;
          *(undefined8 *)((long)a_context + 0x58) = 0;
          *(undefined8 *)((long)a_context + 0x50) = 0;
          *(undefined8 *)((long)a_context + 0x48) = 0;
          *(undefined8 *)((long)a_context + (long)ptV.z._0_4_ * 8 + 0x48) = 0x3ff0000000000000;
        }
        iVar3 = (ptV.z._0_4_ + -1 + ptV.z._4_4_) % ptV.z._4_4_;
        ON_Mesh::Vertex((ON_3dPoint *)&edge.to.z,*a_context,this->vi[iVar3]);
        local_c8 = edge.to.z;
        local_d8 = ptV.y;
        t = distV;
        dStack_e0 = ptV.x;
        from_pt.y = ptPV.x;
        from_pt.x = edge.to.z;
        from_pt.z = ptPV.y;
        to_pt.y = ptV.x;
        to_pt.x = distV;
        to_pt.z = ptV.y;
        ON_Line::ON_Line((ON_Line *)local_b0,from_pt,to_pt);
        local_f0 = 0.0;
        bVar2 = ON_Line::ClosestPointTo
                          ((ON_Line *)local_b0,(ON_3dPoint *)((long)a_context + 8),&local_f0);
        if (((bVar2) && (0.0 <= local_f0)) && (local_f0 <= 1.0)) {
          ON_Line::PointAt((ON_3dPoint *)&distE,(ON_Line *)local_b0,local_f0);
          dVar1 = ON_3dPoint::DistanceTo((ON_3dPoint *)&distE,(ON_3dPoint *)((long)a_context + 8));
          if (dVar1 < *(double *)((long)a_context + 0x68)) {
            *(double *)((long)a_context + 0x68) = dVar1;
            *(int *)((long)a_context + 0x40) = i;
            *(undefined8 *)((long)a_context + 0x60) = 0;
            *(undefined8 *)((long)a_context + 0x58) = 0;
            *(undefined8 *)((long)a_context + 0x50) = 0;
            *(undefined8 *)((long)a_context + 0x48) = 0;
            *(double *)((long)a_context + (long)ptV.z._0_4_ * 8 + 0x48) = local_f0;
            *(double *)((long)a_context + (long)iVar3 * 8 + 0x48) = 1.0 - local_f0;
          }
        }
        ON_Line::~ON_Line((ON_Line *)local_b0);
      }
      local_124 = 1;
      ON_3dex::ON_3dex((ON_3dex *)local_148,0,1,2);
      fcis[0].j = ON_3dex::Unset.i;
      fcis[0].k = ON_3dex::Unset.j;
      fcis[1].i = ON_3dex::Unset.k;
      bVar2 = ON_MeshFace::IsQuad(this);
      if (bVar2) {
        ON_3dex::ON_3dex((ON_3dex *)(vis + 2),0,3,2);
        fcis[0].j = vis[2];
        fcis[0].k = ti;
        fcis[1].i = local_14c;
        local_124 = 2;
      }
      for (vis[1] = 0; vis[1] < local_124; vis[1] = vis[1] + 1) {
        iVar3 = this->vi[fcis[(long)vis[1] + -1].k];
        vis[0] = this->vi[fcis[vis[1]].i];
        ON_Mesh::Vertex((ON_3dPoint *)&t0,*a_context,
                        this->vi[*(int *)(local_148 + (long)vis[1] * 0xc)]);
        ON_Mesh::Vertex((ON_3dPoint *)&pts[0].z,*a_context,iVar3);
        ON_Mesh::Vertex((ON_3dPoint *)&pts[1].z,*a_context,vis[0]);
        t1 = 0.0;
        ptF.z = 0.0;
        bVar2 = ProjectToFaceSpace((ON_3dPoint *)&t0,(ON_3dPoint *)&pts[0].z,(ON_3dPoint *)&pts[1].z
                                   ,(ON_3dPoint *)((long)a_context + 8),&t1,&ptF.z);
        dVar1 = t1;
        if (((bVar2) && (0.0 <= t1)) && ((0.0 <= ptF.z && (t1 + ptF.z <= 1.0)))) {
          ON_3dPoint::operator-(&local_228,(ON_3dPoint *)&pts[0].z,(ON_3dPoint *)&t0);
          operator*(&local_210,dVar1,&local_228);
          ON_3dPoint::operator+(&local_1f8,(ON_3dPoint *)&t0,&local_210);
          dVar1 = ptF.z;
          ON_3dPoint::operator-((ON_3dVector *)&distF,(ON_3dPoint *)&pts[1].z,(ON_3dPoint *)&t0);
          operator*(&local_240,dVar1,(ON_3dVector *)&distF);
          ON_3dPoint::operator+((ON_3dPoint *)local_1e0,&local_1f8,&local_240);
          dVar1 = ON_3dPoint::DistanceTo
                            ((ON_3dPoint *)local_1e0,(ON_3dPoint *)((long)a_context + 8));
          if (dVar1 < *(double *)((long)a_context + 0x68)) {
            *(double *)((long)a_context + 0x68) = dVar1;
            *(int *)((long)a_context + 0x40) = i;
            *(undefined8 *)((long)a_context + 0x60) = 0;
            *(undefined8 *)((long)a_context + 0x58) = 0;
            *(undefined8 *)((long)a_context + 0x50) = 0;
            *(undefined8 *)((long)a_context + 0x48) = 0;
            *(double *)((long)a_context + (long)*(int *)(local_148 + (long)vis[1] * 0xc) * 8 + 0x48)
                 = (1.0 - t1) - ptF.z;
            *(double *)((long)a_context + (long)fcis[(long)vis[1] + -1].k * 8 + 0x48) = t1;
            *(double *)((long)a_context + (long)fcis[vis[1]].i * 8 + 0x48) = ptF.z;
          }
        }
      }
      if (*(double *)((long)a_context + 0x38) <= *(double *)((long)a_context + 0x68)) {
        a_context_local._7_1_ = true;
      }
      else {
        *(undefined8 *)((long)a_context + 0x38) = *(undefined8 *)((long)a_context + 0x68);
        *(undefined1 *)((long)a_context + 0x70) = 1;
        a_context_local._7_1_ = false;
      }
    }
  }
  return a_context_local._7_1_;
}

Assistant:

bool ON_CALLBACK_CDECL MTCB(void* a_context, ON__INT_PTR a_id)
{
  ON__MTCBDATA* pData = (ON__MTCBDATA*)a_context;
  if (nullptr == pData)
    return true;
  pData->m_bRestart = false;
  const int fi = (int)a_id;
  if (fi < 0 || fi >= pData->m_pMesh->m_F.Count())
    return true;
  const ON_MeshFace& face = pData->m_pMesh->m_F[fi];
  const int fcc = face.IsTriangle() ? 3 : 4;
  for (int fci = 0; fci < fcc; fci++)
  {
    // Distance to vertex at corner fci
    const ON_3dPoint ptV = pData->m_pMesh->Vertex(face.vi[fci]);
    const double distV = ptV.DistanceTo(pData->m_pt);
    if (distV < pData->m_dist)
    {
      pData->m_dist = distV;
      pData->m_face_index = fi;
      pData->m_t[0] = pData->m_t[1] = pData->m_t[2] = pData->m_t[3] = 0.0;
      pData->m_t[fci] = 1.0;
    }

    // Distance to edge between corners fci-1 and fci
    const int fcip = (fci + fcc - 1) % fcc;
    const ON_3dPoint ptPV = pData->m_pMesh->Vertex(face.vi[fcip]);
    ON_Line edge(ptPV, ptV);
    double t = 0.0;
    if (edge.ClosestPointTo(pData->m_pt, &t))
    {
      if (t >= 0.0 && t <= 1.0)
      {
        const ON_3dPoint ptE = edge.PointAt(t);
        const double distE = ptE.DistanceTo(pData->m_pt);
        if (distE < pData->m_dist)
        {
          pData->m_dist = distE;
          pData->m_face_index = fi;
          pData->m_t[0] = pData->m_t[1] = pData->m_t[2] = pData->m_t[3] = 0.0;
          pData->m_t[fci] = t;
          pData->m_t[fcip] = 1.0 - t;
        }
      }
    }
  }

  int tris = 1;
  ON_3dex fcis[2] = { {0, 1, 2}, ON_3dex::Unset };
  //int fcis[2][3] = {{0, 1, 2}, {ON_UNSET_INT_INDEX, ON_UNSET_INT_INDEX, ON_UNSET_INT_INDEX}};
  if (face.IsQuad())
  {
    fcis[1] = { 0, 3, 2 };
    tris = 2;
  }

  for (int ti = 0; ti < tris; ti++)
  {
    const int vis[3] = { face.vi[fcis[ti].i] , face.vi[fcis[ti].j], face.vi[fcis[ti].k] };
    const ON_3dPoint pts[3] = { pData->m_pMesh->Vertex(vis[0]), pData->m_pMesh->Vertex(vis[1]), pData->m_pMesh->Vertex(vis[2]) };
    double t0 = 0.0, t1 = 0.0;
    if (ProjectToFaceSpace(pts[0], pts[1], pts[2], pData->m_pt, t0, t1))
    {
      if (0 <= t0 && 0 <= t1 && t0 + t1 <= 1.0)
      {
        const ON_3dPoint ptF = pts[0] + t0 * (pts[1] - pts[0]) + t1 * (pts[2] - pts[0]);
        const double distF = ptF.DistanceTo(pData->m_pt);
        if (distF < pData->m_dist)
        {
          pData->m_dist = distF;
          pData->m_face_index = fi;
          pData->m_t[0] = pData->m_t[1] = pData->m_t[2] = pData->m_t[3] = 0.0;
          pData->m_t[fcis[ti].i] = 1.0 - t0 - t1;
          pData->m_t[fcis[ti].j] = t0;
          pData->m_t[fcis[ti].k] = t1;
        }
      }
    }
  }

  if (pData->m_dist < pData->m_sphere.m_radius)
  {
    pData->m_sphere.m_radius = pData->m_dist;
    pData->m_bRestart = true;
    return false;
  }

  return true;
}